

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Force(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint nIters;
  char *pcVar2;
  uint fVerbose;
  uint fClustered;
  int iVar3;
  char *pcVar4;
  
  Extra_UtilGetoptReset();
  fClustered = 1;
  nIters = 0x14;
  fVerbose = 1;
  while( true ) {
    while( true ) {
      while (iVar1 = Extra_UtilGetopt(argc,argv,"Icvh"), iVar3 = globalUtilOptind, iVar1 == 0x76) {
        fVerbose = fVerbose ^ 1;
      }
      if (iVar1 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          For_ManExperiment(pAbc->pGia,nIters,fClustered,fVerbose);
          return 0;
        }
        pcVar2 = "Abc_CommandAbc9Force(): There is no AIG.\n";
        iVar3 = -1;
        goto LAB_00225f56;
      }
      if (iVar1 != 99) break;
      fClustered = fClustered ^ 1;
    }
    if (iVar1 != 0x49) goto LAB_00225eb5;
    if (argc <= globalUtilOptind) break;
    nIters = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar3 + 1;
    if ((int)nIters < 0) {
LAB_00225eb5:
      Abc_Print(-2,"usage: &force [-I <num>] [-cvh]\n");
      Abc_Print(-2,"\t         one-dimensional placement algorithm FORCE introduced by\n");
      Abc_Print(-2,anon_var_dwarf_7bafc);
      Abc_Print(-2,"\t-I num : the number of refinement iterations [default = %d]\n",(ulong)nIters);
      pcVar4 = "yes";
      pcVar2 = "yes";
      if (fClustered == 0) {
        pcVar2 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle clustered representation [default = %s]\n",pcVar2);
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar4);
      pcVar2 = "\t-h     : print the command usage\n";
      iVar3 = -2;
LAB_00225f56:
      Abc_Print(iVar3,pcVar2);
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
  goto LAB_00225eb5;
}

Assistant:

int Abc_CommandAbc9Force( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int nIters     = 20;
    int fClustered =  1;
    int fVerbose   =  1;
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Icvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIters < 0 )
                goto usage;
            break;
        case 'c':
            fClustered ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Force(): There is no AIG.\n" );
        return 1;
    }
    For_ManExperiment( pAbc->pGia, nIters, fClustered, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: &force [-I <num>] [-cvh]\n" );
    Abc_Print( -2, "\t         one-dimensional placement algorithm FORCE introduced by\n" );
    Abc_Print( -2, "\t         F. A. Aloul, I. L. Markov, and K. A. Sakallah (GLSVLSI�03).\n" );
    Abc_Print( -2, "\t-I num : the number of refinement iterations [default = %d]\n", nIters );
    Abc_Print( -2, "\t-c     : toggle clustered representation [default = %s]\n", fClustered? "yes":"no");
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", fVerbose? "yes":"no");
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}